

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

Qiniu_Error
Qiniu_Rio_Recorder_Write_Medium(Qiniu_Record_Medium *medium,int blkIdx,Qiniu_Rio_BlkputRet *ret)

{
  Qiniu_Uint64 QVar1;
  cJSON *object;
  cJSON *pcVar2;
  char *__ptr;
  Qiniu_Error QVar4;
  char *extraout_RDX;
  undefined1 auVar3 [16];
  char *blockInfoJson;
  cJSON *blockInfo;
  Qiniu_Error err;
  Qiniu_Rio_BlkputRet *ret_local;
  int blkIdx_local;
  Qiniu_Record_Medium *medium_local;
  char *local_10;
  
  object = cJSON_CreateObject();
  pcVar2 = cJSON_CreateNumber((double)blkIdx);
  cJSON_AddItemToObject(object,"blkIdx",pcVar2);
  pcVar2 = cJSON_CreateString(ret->ctx);
  cJSON_AddItemToObject(object,"ctx",pcVar2);
  pcVar2 = cJSON_CreateString(ret->checksum);
  cJSON_AddItemToObject(object,"checksum",pcVar2);
  pcVar2 = cJSON_CreateNumber((double)ret->crc32);
  cJSON_AddItemToObject(object,"crc32",pcVar2);
  pcVar2 = cJSON_CreateNumber((double)ret->offset);
  cJSON_AddItemToObject(object,"offset",pcVar2);
  QVar1 = ret->expiredAt;
  auVar3._8_4_ = (int)(QVar1 >> 0x20);
  auVar3._0_8_ = QVar1;
  auVar3._12_4_ = 0x45300000;
  pcVar2 = cJSON_CreateNumber((auVar3._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)QVar1) - 4503599627370496.0));
  cJSON_AddItemToObject(object,"expiredAt",pcVar2);
  pcVar2 = cJSON_CreateString(ret->host);
  cJSON_AddItemToObject(object,"host",pcVar2);
  __ptr = cJSON_PrintUnformatted(object);
  cJSON_Delete(object);
  if (__ptr == (char *)0x0) {
    medium_local = (Qiniu_Record_Medium *)0x190;
    local_10 = "cJSON_PrintUnformatted() error";
  }
  else {
    QVar4.code = (*medium->writeEntry)(medium,__ptr,(size_t *)0x0);
    medium_local = (Qiniu_Record_Medium *)(ulong)(uint)QVar4.code;
    free(__ptr);
    local_10 = extraout_RDX;
    if (QVar4.code == (Qiniu_Error)0xc8) {
      medium_local = (Qiniu_Record_Medium *)Qiniu_OK._0_8_;
      local_10 = Qiniu_OK.message;
    }
  }
  QVar4._0_8_ = (ulong)medium_local & 0xffffffff;
  QVar4.message = local_10;
  return QVar4;
}

Assistant:

static Qiniu_Error Qiniu_Rio_Recorder_Write_Medium(struct Qiniu_Record_Medium *medium, int blkIdx, Qiniu_Rio_BlkputRet *ret)
{
    Qiniu_Error err;
    cJSON *blockInfo = cJSON_CreateObject();
    cJSON_AddItemToObject(blockInfo, "blkIdx", cJSON_CreateNumber(blkIdx));
    cJSON_AddItemToObject(blockInfo, "ctx", cJSON_CreateString(ret->ctx));
    cJSON_AddItemToObject(blockInfo, "checksum", cJSON_CreateString(ret->checksum));
    cJSON_AddItemToObject(blockInfo, "crc32", cJSON_CreateNumber(ret->crc32));
    cJSON_AddItemToObject(blockInfo, "offset", cJSON_CreateNumber(ret->offset));
    cJSON_AddItemToObject(blockInfo, "expiredAt", cJSON_CreateNumber(ret->expiredAt));
    cJSON_AddItemToObject(blockInfo, "host", cJSON_CreateString(ret->host));
    char *blockInfoJson = cJSON_PrintUnformatted(blockInfo);
    cJSON_Delete(blockInfo);
    if (blockInfoJson == NULL)
    {
        err.code = 400;
        err.message = "cJSON_PrintUnformatted() error";
        return err;
    }
    err = medium->writeEntry(medium, blockInfoJson, NULL);
    free(blockInfoJson);
    if (err.code != 200)
    {
        return err;
    }

    return Qiniu_OK;
}